

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextedit.cpp
# Opt level: O3

int __thiscall QTextEditPrivate::init(QTextEditPrivate *this,EVP_PKEY_CTX *ctx)

{
  QWidget *pQVar1;
  QWidgetTextControl *pQVar2;
  void **ppvVar3;
  QCursorData *pQVar4;
  QWidgetTextControl *this_00;
  QPalette *pal;
  undefined4 *puVar5;
  QSizeF *pQVar6;
  QPaintDevice *pQVar7;
  unsigned_long __i0;
  long lVar8;
  long in_FS_OFFSET;
  code *local_118;
  ImplFn local_110;
  code *local_108;
  ImplFn local_100;
  code *local_f8;
  ImplFn local_f0;
  code *local_e8;
  ImplFn local_e0;
  code *local_d8;
  ImplFn local_d0;
  code *local_c8;
  ImplFn local_c0;
  code *local_b8;
  undefined8 local_b0;
  QCursor local_a8;
  undefined8 uStack_a0;
  QObject local_98 [8];
  QObject local_90 [8];
  QObject local_88 [8];
  QObject local_80 [8];
  QObject local_78 [8];
  QObject local_70 [8];
  QObject local_68 [8];
  QObject local_60 [8];
  QObject local_58 [8];
  QObject local_50 [8];
  QObject local_48 [16];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = *(QWidget **)
            &(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.super_QWidgetPrivate.
             field_0x8;
  this_00 = (QWidgetTextControl *)operator_new(0x18);
  QWidgetTextControl::QWidgetTextControl(this_00,&pQVar1->super_QObject);
  *(undefined ***)this_00 = &PTR_metaObject_007fd248;
  this->control = (QWidgetTextControl *)this_00;
  pal = QWidget::palette(pQVar1);
  QWidgetTextControl::setPalette(this_00,pal);
  pQVar2 = this->control;
  local_b8 = QWidgetTextControl::documentSizeChanged;
  lVar8 = 0;
  local_b0 = 0;
  local_c8 = adjustScrollbars;
  local_c0 = (ImplFn)0x0;
  ppvVar3 = *(void ***)
             &(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.super_QWidgetPrivate.
              field_0x8;
  puVar5 = (undefined4 *)operator_new(0x20);
  *puVar5 = 1;
  *(code **)(puVar5 + 2) =
       QtPrivate::QPrivateSlotObject<void_(QTextEditPrivate::*)(),_QtPrivate::List<>,_void>::impl;
  *(code **)(puVar5 + 4) = adjustScrollbars;
  *(undefined8 *)(puVar5 + 6) = 0;
  QObject::connectImpl
            ((QObject *)&local_a8,(void **)pQVar2,(QObject *)&local_b8,ppvVar3,
             (QSlotObjectBase *)&local_c8,(ConnectionType)puVar5,(int *)0x0,(QMetaObject *)0x0);
  pQVar2 = this->control;
  local_b8 = QWidgetTextControl::updateRequest;
  local_b0 = 0;
  local_c8 = repaintContents;
  local_c0 = (ImplFn)0x0;
  ppvVar3 = *(void ***)
             &(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.super_QWidgetPrivate.
              field_0x8;
  puVar5 = (undefined4 *)operator_new(0x20);
  *puVar5 = 1;
  *(code **)(puVar5 + 2) =
       QtPrivate::
       QPrivateSlotObject<void_(QTextEditPrivate::*)(const_QRectF_&),_QtPrivate::List<const_QRectF_&>,_void>
       ::impl;
  *(code **)(puVar5 + 4) = repaintContents;
  *(undefined8 *)(puVar5 + 6) = 0;
  QObject::connectImpl
            ((QObject *)&uStack_a0,(void **)pQVar2,(QObject *)&local_b8,ppvVar3,
             (QSlotObjectBase *)&local_c8,(ConnectionType)puVar5,(int *)0x0,(QMetaObject *)0x0);
  pQVar2 = this->control;
  local_b8 = QWidgetTextControl::visibilityRequest;
  local_b0 = 0;
  local_c8 = ensureVisible;
  local_c0 = (ImplFn)0x0;
  ppvVar3 = *(void ***)
             &(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.super_QWidgetPrivate.
              field_0x8;
  puVar5 = (undefined4 *)operator_new(0x20);
  *puVar5 = 1;
  *(code **)(puVar5 + 2) =
       QtPrivate::
       QPrivateSlotObject<void_(QTextEditPrivate::*)(const_QRectF_&),_QtPrivate::List<const_QRectF_&>,_void>
       ::impl;
  *(code **)(puVar5 + 4) = ensureVisible;
  *(undefined8 *)(puVar5 + 6) = 0;
  QObject::connectImpl
            (local_98,(void **)pQVar2,(QObject *)&local_b8,ppvVar3,(QSlotObjectBase *)&local_c8,
             (ConnectionType)puVar5,(int *)0x0,(QMetaObject *)0x0);
  pQVar2 = this->control;
  local_b8 = QWidgetTextControl::blockMarkerHovered;
  local_b0 = 0;
  local_c8 = hoveredBlockWithMarkerChanged;
  local_c0 = (ImplFn)0x0;
  ppvVar3 = *(void ***)
             &(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.super_QWidgetPrivate.
              field_0x8;
  puVar5 = (undefined4 *)operator_new(0x20);
  *puVar5 = 1;
  *(code **)(puVar5 + 2) =
       QtPrivate::
       QPrivateSlotObject<void_(QTextEditPrivate::*)(const_QTextBlock_&),_QtPrivate::List<const_QTextBlock_&>,_void>
       ::impl;
  *(code **)(puVar5 + 4) = hoveredBlockWithMarkerChanged;
  *(undefined8 *)(puVar5 + 6) = 0;
  QObject::connectImpl
            (local_90,(void **)pQVar2,(QObject *)&local_b8,ppvVar3,(QSlotObjectBase *)&local_c8,
             (ConnectionType)puVar5,(int *)0x0,(QMetaObject *)0x0);
  pQVar2 = this->control;
  local_b8 = QWidgetTextControl::cursorPositionChanged;
  local_b0 = 0;
  local_c8 = cursorPositionChanged;
  local_c0 = (ImplFn)0x0;
  ppvVar3 = *(void ***)
             &(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.super_QWidgetPrivate.
              field_0x8;
  puVar5 = (undefined4 *)operator_new(0x20);
  *puVar5 = 1;
  *(code **)(puVar5 + 2) =
       QtPrivate::QPrivateSlotObject<void_(QTextEditPrivate::*)(),_QtPrivate::List<>,_void>::impl;
  *(code **)(puVar5 + 4) = cursorPositionChanged;
  *(undefined8 *)(puVar5 + 6) = 0;
  QObject::connectImpl
            (local_88,(void **)pQVar2,(QObject *)&local_b8,ppvVar3,(QSlotObjectBase *)&local_c8,
             (ConnectionType)puVar5,(int *)0x0,(QMetaObject *)0x0);
  pQVar2 = this->control;
  local_b8 = QWidgetTextControl::microFocusChanged;
  local_b0 = 0;
  puVar5 = (undefined4 *)operator_new(0x18);
  *puVar5 = 1;
  *(code **)(puVar5 + 2) =
       QtPrivate::
       QCallableObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/widgets/widgets/qtextedit.cpp:143:29),_QtPrivate::List<>,_void>
       ::impl;
  *(QWidget **)(puVar5 + 4) = pQVar1;
  QObject::connectImpl
            (local_80,(void **)pQVar2,(QObject *)&local_b8,(void **)pQVar1,(QSlotObjectBase *)0x0,
             (ConnectionType)puVar5,(int *)0x0,(QMetaObject *)0x0);
  pQVar2 = this->control;
  local_c8 = QTextEdit::currentCharFormatChanged;
  local_c0 = (ImplFn)0x0;
  local_b8 = QWidgetTextControl::currentCharFormatChanged;
  local_b0 = 0;
  puVar5 = (undefined4 *)operator_new(0x20);
  *puVar5 = 1;
  *(code **)(puVar5 + 2) =
       QtPrivate::
       QCallableObject<void_(QTextEdit::*)(const_QTextCharFormat_&),_QtPrivate::List<const_QTextCharFormat_&>,_void>
       ::impl;
  *(code **)(puVar5 + 4) = QTextEdit::currentCharFormatChanged;
  *(undefined8 *)(puVar5 + 6) = 0;
  QObject::connectImpl
            (local_78,(void **)pQVar2,(QObject *)&local_b8,(void **)pQVar1,
             (QSlotObjectBase *)&local_c8,(ConnectionType)puVar5,(int *)0x0,(QMetaObject *)0x0);
  pQVar2 = this->control;
  local_d8 = QTextEdit::textChanged;
  local_d0 = (ImplFn)0x0;
  local_b8 = QWidgetTextControl::textChanged;
  local_b0 = 0;
  puVar5 = (undefined4 *)operator_new(0x20);
  *puVar5 = 1;
  *(code **)(puVar5 + 2) =
       QtPrivate::QCallableObject<void_(QTextEdit::*)(),_QtPrivate::List<>,_void>::impl;
  *(code **)(puVar5 + 4) = QTextEdit::textChanged;
  *(undefined8 *)(puVar5 + 6) = 0;
  QObject::connectImpl
            (local_70,(void **)pQVar2,(QObject *)&local_b8,(void **)pQVar1,
             (QSlotObjectBase *)&local_d8,(ConnectionType)puVar5,(int *)0x0,(QMetaObject *)0x0);
  pQVar2 = this->control;
  local_e8 = QTextEdit::undoAvailable;
  local_e0 = (ImplFn)0x0;
  local_b8 = QWidgetTextControl::undoAvailable;
  local_b0 = 0;
  puVar5 = (undefined4 *)operator_new(0x20);
  *puVar5 = 1;
  *(code **)(puVar5 + 2) =
       QtPrivate::QCallableObject<void_(QTextEdit::*)(bool),_QtPrivate::List<bool>,_void>::impl;
  *(code **)(puVar5 + 4) = QTextEdit::undoAvailable;
  *(undefined8 *)(puVar5 + 6) = 0;
  QObject::connectImpl
            (local_68,(void **)pQVar2,(QObject *)&local_b8,(void **)pQVar1,
             (QSlotObjectBase *)&local_e8,(ConnectionType)puVar5,(int *)0x0,(QMetaObject *)0x0);
  pQVar2 = this->control;
  local_f8 = QTextEdit::redoAvailable;
  local_f0 = (ImplFn)0x0;
  local_b8 = QWidgetTextControl::redoAvailable;
  local_b0 = 0;
  puVar5 = (undefined4 *)operator_new(0x20);
  *puVar5 = 1;
  *(code **)(puVar5 + 2) =
       QtPrivate::QCallableObject<void_(QTextEdit::*)(bool),_QtPrivate::List<bool>,_void>::impl;
  *(code **)(puVar5 + 4) = QTextEdit::redoAvailable;
  *(undefined8 *)(puVar5 + 6) = 0;
  QObject::connectImpl
            (local_60,(void **)pQVar2,(QObject *)&local_b8,(void **)pQVar1,
             (QSlotObjectBase *)&local_f8,(ConnectionType)puVar5,(int *)0x0,(QMetaObject *)0x0);
  pQVar2 = this->control;
  local_108 = QTextEdit::copyAvailable;
  local_100 = (ImplFn)0x0;
  local_b8 = QWidgetTextControl::copyAvailable;
  local_b0 = 0;
  puVar5 = (undefined4 *)operator_new(0x20);
  *puVar5 = 1;
  *(code **)(puVar5 + 2) =
       QtPrivate::QCallableObject<void_(QTextEdit::*)(bool),_QtPrivate::List<bool>,_void>::impl;
  *(code **)(puVar5 + 4) = QTextEdit::copyAvailable;
  *(undefined8 *)(puVar5 + 6) = 0;
  QObject::connectImpl
            (local_58,(void **)pQVar2,(QObject *)&local_b8,(void **)pQVar1,
             (QSlotObjectBase *)&local_108,(ConnectionType)puVar5,(int *)0x0,(QMetaObject *)0x0);
  pQVar2 = this->control;
  local_118 = QTextEdit::selectionChanged;
  local_110 = (ImplFn)0x0;
  local_b8 = QWidgetTextControl::selectionChanged;
  local_b0 = 0;
  puVar5 = (undefined4 *)operator_new(0x20);
  *puVar5 = 1;
  *(code **)(puVar5 + 2) =
       QtPrivate::QCallableObject<void_(QTextEdit::*)(),_QtPrivate::List<>,_void>::impl;
  *(code **)(puVar5 + 4) = QTextEdit::selectionChanged;
  *(undefined8 *)(puVar5 + 6) = 0;
  QObject::connectImpl
            (local_50,(void **)pQVar2,(QObject *)&local_b8,(void **)pQVar1,
             (QSlotObjectBase *)&local_118,(ConnectionType)puVar5,(int *)0x0,(QMetaObject *)0x0);
  pQVar2 = this->control;
  local_b8 = QWidgetTextControl::textChanged;
  local_b0 = 0;
  puVar5 = (undefined4 *)operator_new(0x18);
  *puVar5 = 1;
  *(code **)(puVar5 + 2) =
       QtPrivate::
       QCallableObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/widgets/widgets/qtextedit.cpp:157:29),_QtPrivate::List<>,_void>
       ::impl;
  *(QWidget **)(puVar5 + 4) = pQVar1;
  QObject::connectImpl
            (local_48,(void **)pQVar2,(QObject *)&local_b8,(void **)pQVar1,(QSlotObjectBase *)0x0,
             (ConnectionType)puVar5,(int *)0x0,(QMetaObject *)0x0);
  do {
    pQVar4 = *(QCursorData **)(&(this->connections).field_0x0 + lVar8 * 8);
    *(QCursorData **)(&(this->connections).field_0x0 + lVar8 * 8) = (&local_a8)[lVar8].d;
    (&local_a8)[lVar8].d = pQVar4;
    lVar8 = lVar8 + 1;
  } while (lVar8 != 0xd);
  lVar8 = 0x60;
  do {
    QMetaObject::Connection::~Connection((Connection *)((long)&local_a8.d + lVar8));
    lVar8 = lVar8 + -8;
  } while (lVar8 != -8);
  pQVar6 = (QSizeF *)QWidgetTextControl::document((QWidgetTextControl *)this->control);
  local_a8.d = (QCursorData *)0x0;
  uStack_a0 = 0;
  QTextDocument::setPageSize(pQVar6);
  pQVar7 = (QPaintDevice *)QTextDocument::documentLayout();
  QAbstractTextDocumentLayout::setPaintDevice(pQVar7);
  QTextDocument::setDefaultFont((QFont *)pQVar6);
  QTextDocument::setUndoRedoEnabled(SUB81(pQVar6,0));
  QTextDocument::setUndoRedoEnabled(SUB81(pQVar6,0));
  if (*(long *)(ctx + 0x10) != 0) {
    QWidgetTextControl::setHtml((QWidgetTextControl *)this->control,(QString *)ctx);
  }
  QAbstractSlider::setSingleStep
            (&((this->super_QAbstractScrollAreaPrivate).hbar)->super_QAbstractSlider,0x14);
  QAbstractSlider::setSingleStep
            (&((this->super_QAbstractScrollAreaPrivate).vbar)->super_QAbstractSlider,0x14);
  QWidget::setBackgroundRole((this->super_QAbstractScrollAreaPrivate).viewport,Base);
  QWidget::setAttribute(pQVar1,WA_MouseTracking,true);
  QWidget::setAcceptDrops(pQVar1,true);
  QWidget::setFocusPolicy(pQVar1,StrongFocus);
  QWidget::setAttribute(pQVar1,WA_KeyCompression,true);
  QWidget::setAttribute(pQVar1,WA_InputMethodEnabled,true);
  QWidget::setInputMethodHints(pQVar1,(InputMethodHints)0x400);
  pQVar1 = (this->super_QAbstractScrollAreaPrivate).viewport;
  QCursor::QCursor(&local_a8,IBeamCursor);
  QWidget::setCursor(pQVar1,&local_a8);
  QCursor::~QCursor(&local_a8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (int)*(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void QTextEditPrivate::init(const QString &html)
{
    Q_Q(QTextEdit);
    control = new QTextEditControl(q);
    control->setPalette(q->palette());

    connections = {
        QObjectPrivate::connect(control, &QTextEditControl::documentSizeChanged,
                                this, &QTextEditPrivate::adjustScrollbars),
        QObjectPrivate::connect(control, &QTextEditControl::updateRequest,
                                this, &QTextEditPrivate::repaintContents),
        QObjectPrivate::connect(control, &QTextEditControl::visibilityRequest,
                                this, &QTextEditPrivate::ensureVisible),
        QObjectPrivate::connect(control, &QTextEditControl::blockMarkerHovered,
                                this, &QTextEditPrivate::hoveredBlockWithMarkerChanged),
        QObjectPrivate::connect(control, &QTextEditControl::cursorPositionChanged,
                                this, &QTextEditPrivate::cursorPositionChanged),
        QObject::connect(control, &QTextEditControl::microFocusChanged,
                         q, [q]() { q->updateMicroFocus(); }),
        QObject::connect(control, &QTextEditControl::currentCharFormatChanged,
                         q, &QTextEdit::currentCharFormatChanged),
        QObject::connect(control, &QTextEditControl::textChanged,
                         q, &QTextEdit::textChanged),
        QObject::connect(control, &QTextEditControl::undoAvailable,
                         q, &QTextEdit::undoAvailable),
        QObject::connect(control, &QTextEditControl::redoAvailable,
                         q, &QTextEdit::redoAvailable),
        QObject::connect(control, &QTextEditControl::copyAvailable,
                         q, &QTextEdit::copyAvailable),
        QObject::connect(control, &QTextEditControl::selectionChanged,
                         q, &QTextEdit::selectionChanged),
        QObject::connect(control, &QTextEditControl::textChanged,
                         q, [q]() { q->updateMicroFocus(); }),
    };

    QTextDocument *doc = control->document();
    // set a null page size initially to avoid any relayouting until the textedit
    // is shown. relayoutDocument() will take care of setting the page size to the
    // viewport dimensions later.
    doc->setPageSize(QSize(0, 0));
    doc->documentLayout()->setPaintDevice(viewport);
    doc->setDefaultFont(q->font());
    doc->setUndoRedoEnabled(false); // flush undo buffer.
    doc->setUndoRedoEnabled(true);

    if (!html.isEmpty())
        control->setHtml(html);

    hbar->setSingleStep(20);
    vbar->setSingleStep(20);

    viewport->setBackgroundRole(QPalette::Base);
    q->setMouseTracking(true);
    q->setAcceptDrops(true);
    q->setFocusPolicy(Qt::StrongFocus);
    q->setAttribute(Qt::WA_KeyCompression);
    q->setAttribute(Qt::WA_InputMethodEnabled);
    q->setInputMethodHints(Qt::ImhMultiLine);
#ifndef QT_NO_CURSOR
    viewport->setCursor(Qt::IBeamCursor);
#endif
}